

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

void Gia_ManSimGen(Gia_Man_t *pGia)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *__s;
  word wVar6;
  FILE *__s_00;
  Vec_Int_t *pVVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uint uVar13;
  ulong uVar14;
  
  iVar5 = pGia->vCis->nSize;
  uVar8 = (long)iVar5 << 2;
  iVar3 = (int)uVar8;
  iVar4 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar4 = iVar3;
  }
  if (iVar4 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar4 << 3);
  }
  memset(__s,0,(long)iVar5 << 5);
  if (0 < iVar5) {
    uVar14 = 0;
    do {
      wVar6 = Abc_RandomW(0);
      *(word *)((long)__s + uVar14 * 8) = wVar6;
      uVar14 = uVar14 + 1;
    } while ((uVar8 & 0xffffffff) != uVar14);
  }
  __s_00 = fopen("comp_sim.c","wb");
  fwrite("#include <stdio.h>\n",0x13,1,__s_00);
  fwrite("#include <stdlib.h>\n",0x14,1,__s_00);
  fwrite("#include <time.h>\n",0x12,1,__s_00);
  fwrite("int main()\n",0xb,1,__s_00);
  fwrite("{\n",2,1,__s_00);
  fwrite("  clock_t clkThis = clock();\n",0x1d,1,__s_00);
  fwrite("  unsigned long Res = 0;\n",0x19,1,__s_00);
  fwrite("  int i;\n",9,1,__s_00);
  fwrite("  srand(time(NULL));\n",0x15,1,__s_00);
  fwrite("  for ( i = 0; i < 2000; i++ )\n",0x1f,1,__s_00);
  fwrite("  {\n",4,1,__s_00);
  uVar8 = 0;
  do {
    fprintf(__s_00,"  unsigned long s%07d_%d = 0x%08x%08x;\n",0,uVar8,0,0);
    uVar10 = (int)uVar8 + 1;
    uVar8 = (ulong)uVar10;
  } while (uVar10 != 4);
  pVVar7 = pGia->vCis;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    do {
      uVar10 = pVVar7->pArray[lVar9];
      if (((int)uVar10 < 0) || (pGia->nObjs <= (int)uVar10)) goto LAB_007db0ae;
      if (uVar10 == 0) break;
      uVar8 = 0;
      do {
        fprintf(__s_00,
                "  unsigned long s%07d_%d = ((unsigned long)rand() << 48) | ((unsigned long)rand() << 32) | ((unsigned long)rand() << 16) | (unsigned long)rand();\n"
                ,(ulong)uVar10,uVar8);
        uVar13 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar13;
      } while (uVar13 != 4);
      lVar9 = lVar9 + 1;
      pVVar7 = pGia->vCis;
    } while (lVar9 < pVVar7->nSize);
  }
  iVar5 = pGia->nObjs;
  if (0 < iVar5) {
    uVar8 = 0;
    do {
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = pGia->pObjs + uVar8;
      uVar10 = *(uint *)pGVar2;
      if ((~uVar10 & 0x1fffffff) != 0 && -1 < (int)uVar10) {
        uVar14 = 0;
        do {
          uVar1 = *(ulong *)pGVar2;
          uVar11 = 0x7e;
          if (((uint)uVar1 >> 0x1d & 1) == 0) {
            uVar11 = 0x20;
          }
          uVar12 = 0x20;
          if ((uVar1 >> 0x3d & 1) == 0) {
            uVar12 = 0x7e;
          }
          fprintf(__s_00,"  unsigned long s%07d_%d = %cs%07d_%d & %cs%07d_%d;\n",uVar8 & 0xffffffff,
                  uVar14,uVar11,(ulong)((int)uVar8 - ((uint)uVar1 & 0x1fffffff)),uVar14,uVar12,
                  (ulong)((int)uVar8 - ((uint)(uVar1 >> 0x20) & 0x1fffffff)),uVar14);
          uVar10 = (int)uVar14 + 1;
          uVar14 = (ulong)uVar10;
        } while (uVar10 != 4);
        iVar5 = pGia->nObjs;
      }
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < (long)iVar5);
  }
  pVVar7 = pGia->vCos;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    do {
      iVar5 = pVVar7->pArray[lVar9];
      if (((long)iVar5 < 0) || (pGia->nObjs <= iVar5)) {
LAB_007db0ae:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar5 == 0) break;
      pGVar2 = pGia->pObjs;
      uVar8 = 0;
      do {
        uVar11 = 0x7e;
        if ((*(uint *)(pGVar2 + iVar5) >> 0x1d & 1) == 0) {
          uVar11 = 0x20;
        }
        fprintf(__s_00,"  Res ^= %cs%07d_%d;\n",uVar11,
                (ulong)(iVar5 - (*(uint *)(pGVar2 + iVar5) & 0x1fffffff)),uVar8);
        uVar10 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar10;
      } while (uVar10 != 4);
      lVar9 = lVar9 + 1;
      pVVar7 = pGia->vCos;
    } while (lVar9 < pVVar7->nSize);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  fwrite("  }\n",4,1,__s_00);
  fprintf(__s_00,"  printf( \"Res = 0x%%08x    \", (unsigned)Res );\n");
  fprintf(__s_00,
          "  printf( \"Time = %%6.2f sec\\n\", (float)(clock() - clkThis)/CLOCKS_PER_SEC );\n");
  fwrite("  return 1;\n",0xc,1,__s_00);
  fwrite("}\n",2,1,__s_00);
  fclose(__s_00);
  return;
}

Assistant:

void Gia_ManSimGen( Gia_Man_t * pGia )
{
    int nWords = 4;
    Gia_Obj_t * pObj;
    Vec_Wrd_t * vSim0 = Vec_WrdStartRandom( Gia_ManCiNum(pGia) * nWords );
    FILE * pFile = fopen( "comp_sim.c", "wb" );
    int i, k, Id;
    fprintf( pFile, "#include <stdio.h>\n" );
    fprintf( pFile, "#include <stdlib.h>\n" );
    fprintf( pFile, "#include <time.h>\n" );
    fprintf( pFile, "int main()\n" );
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  clock_t clkThis = clock();\n" );
    fprintf( pFile, "  unsigned long Res = 0;\n" );
    fprintf( pFile, "  int i;\n" );
    fprintf( pFile, "  srand(time(NULL));\n" );
    fprintf( pFile, "  for ( i = 0; i < 2000; i++ )\n" );
    fprintf( pFile, "  {\n" );
    for ( k = 0; k < nWords; k++ )
        fprintf( pFile, "  unsigned long s%07d_%d = 0x%08x%08x;\n", 0, k, 0, 0 );
    Gia_ManForEachCiId( pGia, Id, i )
    {
        //word * pSim = Vec_WrdEntryP(vSim0, i*nWords);
        //unsigned * pSimU = (unsigned *)pSim;
        for ( k = 0; k < nWords; k++ )
            fprintf( pFile, "  unsigned long s%07d_%d = ((unsigned long)rand() << 48) | ((unsigned long)rand() << 32) | ((unsigned long)rand() << 16) | (unsigned long)rand();\n", Id, k );
    }
    Gia_ManForEachAnd( pGia, pObj, Id )
    {
        for ( k = 0; k < nWords; k++ )
            fprintf( pFile, "  unsigned long s%07d_%d = %cs%07d_%d & %cs%07d_%d;\n", Id, k, 
                Gia_ObjFaninC0(pObj) ? '~' : ' ', Gia_ObjFaninId0(pObj, Id), k, 
                Gia_ObjFaninC1(pObj) ? ' ' : '~', Gia_ObjFaninId1(pObj, Id), k );
    }
    Gia_ManForEachCoId( pGia, Id, i )
    {
        pObj = Gia_ManObj(pGia, Id);
        for ( k = 0; k < nWords; k++ )
            fprintf( pFile, "  Res ^= %cs%07d_%d;\n", Gia_ObjFaninC0(pObj) ? '~' : ' ', Gia_ObjFaninId0(pObj, Id), k );
    }
    Vec_WrdFree( vSim0 );
    fprintf( pFile, "  }\n" );
    fprintf( pFile, "  printf( \"Res = 0x%%08x    \", (unsigned)Res );\n" );
    fprintf( pFile, "  printf( \"Time = %%6.2f sec\\n\", (float)(clock() - clkThis)/CLOCKS_PER_SEC );\n" );
    fprintf( pFile, "  return 1;\n" );
    fprintf( pFile, "}\n" );
    fclose( pFile );
}